

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O2

string * __thiscall
wasm::generateWasm2CWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  wasm *this_00;
  size_t sVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  char cVar3;
  BasicType BVar4;
  long *plVar5;
  ulong extraout_RDX;
  char *__assertion;
  Type in_R9;
  bool bVar6;
  Name NVar7;
  Name name;
  Signature sig;
  undefined1 auVar8 [16];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  undefined1 local_248 [8];
  Iterator __begin2;
  string local_c0;
  long *local_a0;
  wasm *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  unsigned_long local_50;
  long *local_48;
  allocator<char> local_39;
  Type local_38;
  Type result;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n#include <inttypes.h>\n#include <stdint.h>\n#include <stdio.h>\n\n#include \"wasm-rt-impl.h\"\n#include \"wasm.h\"\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {\n  printf(\"[LoggingExternalInterface logging %d]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {\n  printf(\"[LoggingExternalInterface logging %\" PRId64 \"]\\n\", (int64_t)x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {\n  printf(\"[LoggingExternalInterface logging %d %d]\\n\", x, y);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {\n  printf(\"[LoggingExternalInterface logging %.17e]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {\n  printf(\"[LoggingExternalInterface logging %.17le]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;\n\n// Miscellaneous imports\n\nu32 tempRet0 = 0;\n\nvoid _Z_envZ_setTempRet0Z_vi(u32 x) {\n  tempRet0 = x;\n}\nvoid (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;\n\nu32 _Z_envZ_getTempRet0Z_iv(void) {\n  return tempRet0;\n}\nu32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;\n\n// Main\n\nint main(int argc, char** argv) {\n  init();\n\n  // We go through each export and call it, in turn. Note that we use a loop\n  // so we can do all this with a single setjmp. A setjmp is needed to handle\n  // wasm traps, and emitting a single one helps compilation speed into wasm as\n  // compile times are O(size * num_setjmps).\n  for (size_t curr = 0;; curr++) {\n  "
             ,(allocator<char> *)local_248);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  plVar5 = *(long **)this;
  local_a0 = *(long **)(this + 8);
  local_50 = 0;
  local_98 = this;
  do {
    if (plVar5 == local_a0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_48 = plVar5;
    if (*(int *)(*plVar5 + 0x20) == 0) {
      std::__cxx11::to_string(&local_90,local_50);
      std::operator+(&local_70,"        case ",&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     &local_70,":\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      NVar7.super_IString.str._M_str = *(char **)(*local_48 + 0x10);
      NVar7.super_IString.str._M_len = (size_t)local_98;
      ::wasm::Module::getFunction(NVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"          puts(\"[fuzz-exec] calling ",
                 (allocator<char> *)&local_38);
      IString::toString_abi_cxx11_(&local_c0,(IString *)*local_48);
      std::operator+(&local_70,&local_90,&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     &local_70,"\");\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_90);
      ::wasm::HeapType::getSignature();
      local_38.id = extraout_RDX;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_38.id != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"printf(\"[fuzz-exec] note result: ",&local_39);
        IString::toString_abi_cxx11_(&local_c0,(IString *)*local_48);
        std::operator+(&local_70,&local_90,&local_c0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,&local_70," => ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_90);
        cVar3 = ::wasm::Type::isTuple();
        if (cVar3 != '\0') {
          __assertion = "!result.isTuple() && \"Unexpected tuple type\"";
LAB_0018ff7c:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm2c-wrapper.h"
                        ,0xab,"std::string wasm::generateWasm2CWrapper(Module &)");
        }
        if (6 < local_38.id) {
          __assertion = "result.isBasic() && \"TODO: handle compound types\"";
          goto LAB_0018ff7c;
        }
        BVar4 = Type::getBasic(&local_38);
        if (3 < BVar4 - i32) {
          Fatal::Fatal((Fatal *)local_248);
          std::operator<<((ostream *)
                          &__begin2.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          ,"unhandled wasm2c wrapper result type: ");
          Fatal::operator<<((Fatal *)local_248,&local_38);
          Fatal::~Fatal((Fatal *)local_248);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      this_00 = *(wasm **)*local_48;
      sVar1 = ((undefined8 *)*local_48)[1];
      auVar8 = ::wasm::HeapType::getSignature();
      name.super_IString.str._M_str = auVar8._0_8_;
      name.super_IString.str._M_len = sVar1;
      sig.results.id = in_R9.id;
      sig.params.id = auVar8._8_8_;
      wasm2cMangle_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 this_00,name,sig);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_70._M_dataplus._M_p = (pointer)::wasm::HeapType::getSignature();
      local_248 = (undefined1  [8])&local_70;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)local_248);
      local_50 = local_50 + 1;
      bVar6 = true;
      for (; PVar2.index = (size_t)__begin2.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar2.parent = (Type *)local_248, PVar9 != PVar2;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        ::wasm::Type::Iterator::operator*((Iterator *)local_248);
        if (!bVar6) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        bVar6 = false;
      }
      if (local_38.id != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    plVar5 = local_48 + 1;
  } while( true );
}

Assistant:

inline std::string generateWasm2CWrapper(Module& wasm) {
  // First, emit implementations of the wasm's imports so that the wasm2c code
  // can call them. The names use wasm2c's name mangling.
  std::string ret = R"(
#include <inttypes.h>
#include <stdint.h>
#include <stdio.h>

#include "wasm-rt-impl.h"
#include "wasm.h"

void _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {
  printf("[LoggingExternalInterface logging %d]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {
  printf("[LoggingExternalInterface logging %" PRId64 "]\n", (int64_t)x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {
  printf("[LoggingExternalInterface logging %d %d]\n", x, y);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;

void _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {
  printf("[LoggingExternalInterface logging %.17e]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;

void _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {
  printf("[LoggingExternalInterface logging %.17le]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;

// Miscellaneous imports

u32 tempRet0 = 0;

void _Z_envZ_setTempRet0Z_vi(u32 x) {
  tempRet0 = x;
}
void (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;

u32 _Z_envZ_getTempRet0Z_iv(void) {
  return tempRet0;
}
u32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;

// Main

int main(int argc, char** argv) {
  init();

  // We go through each export and call it, in turn. Note that we use a loop
  // so we can do all this with a single setjmp. A setjmp is needed to handle
  // wasm traps, and emitting a single one helps compilation speed into wasm as
  // compile times are O(size * num_setjmps).
  for (size_t curr = 0;; curr++) {
  )";
  ret += R"(
    // Prepare to call the export, so we can catch traps.
    if (WASM_RT_SETJMP(g_jmp_buf) != 0) {
      puts("exception!");
    } else {
      // Call the proper export.
      switch(curr) {
)";

  // For each function export in the wasm, emit code to call it and log its
  // result, similar to the other wrappers.
  size_t functionExportIndex = 0;

  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue;
    }

    ret += "        case " + std::to_string(functionExportIndex++) + ":\n";

    auto* func = wasm.getFunction(exp->value);

    ret += std::string("          puts(\"[fuzz-exec] calling ") +
           exp->name.toString() + "\");\n";
    auto result = func->getResults();

    // Emit the call itself.
    ret += "            ";
    if (result != Type::none) {
      ret += std::string("printf(\"[fuzz-exec] note result: ") +
             exp->name.toString() + " => ";
      TODO_SINGLE_COMPOUND(result);
      switch (result.getBasic()) {
        case Type::i32:
          ret += "%d\\n\", ";
          break;
        case Type::i64:
          ret += "%\" PRId64 \"\\n\", (int64_t)";
          break;
        case Type::f32:
          ret += "%.17e\\n\", ";
          break;
        case Type::f64:
          ret += "%.17le\\n\", ";
          break;
        default:
          Fatal() << "unhandled wasm2c wrapper result type: " << result;
      }
    }

    // Call the export.
    ret += "(*";

    // Emit the callee's name with wasm2c name mangling.
    ret += wasm2cMangle(exp->name, func->getSig());

    ret += ")(";

    // Emit the parameters (all 0s, like the other wrappers).
    bool first = true;
    for ([[maybe_unused]] const auto& param : func->getParams()) {
      if (!first) {
        ret += ", ";
      }
      ret += "0";
      first = false;
    }
    if (result != Type::none) {
      ret += ")";
    }
    ret += ");\n";

    // Break from the big switch.
    ret += "          break;\n";
  }

  ret += R"(        default:
          return 0; // All done.
      }
    }
  }
  return 0;
}
)";

  return ret;
}